

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O3

char * INT_create_multityped_action_spec(FMStructDescList *input_format_lists,char *function)

{
  char **ppcVar1;
  FMStructDescList *pp_Var2;
  char *pcVar3;
  FMStructDescList p_Var4;
  size_t sVar5;
  size_t sVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  FMStructDescList p_Var11;
  
  if (input_format_lists == (FMStructDescList *)0x0) {
    uVar7 = 0;
  }
  else {
    uVar7 = 0xffffffff;
    pp_Var2 = input_format_lists;
    do {
      uVar7 = uVar7 + 1;
      p_Var11 = *pp_Var2;
      pp_Var2 = pp_Var2 + 1;
    } while (p_Var11 != (FMStructDescList)0x0);
  }
  pcVar3 = (char *)INT_CMmalloc(0x32);
  sprintf(pcVar3,"Multityped Action   List Count %d\n",(ulong)uVar7);
  if (uVar7 != 0) {
    uVar10 = 0;
    do {
      p_Var11 = input_format_lists[uVar10];
      uVar8 = 0;
      if (p_Var11 != (FMStructDescList)0x0) {
        uVar8 = 0xffffffff;
        p_Var4 = p_Var11;
        do {
          uVar8 = uVar8 + 1;
          ppcVar1 = &p_Var4->format_name;
          p_Var4 = p_Var4 + 1;
        } while (*ppcVar1 != (char *)0x0);
      }
      sVar5 = strlen(pcVar3);
      pcVar3 = (char *)INT_CMrealloc(pcVar3,sVar5 + 0x32);
      sVar5 = strlen(pcVar3);
      sprintf(pcVar3 + sVar5,"Next format   Subformat Count %d\n",(ulong)uVar8);
      if (uVar8 != 0) {
        uVar9 = (ulong)uVar8;
        do {
          pcVar3 = add_FMfieldlist_to_string(pcVar3,p_Var11);
          p_Var11 = p_Var11 + 1;
          uVar9 = uVar9 - 1;
        } while (uVar9 != 0);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar7);
  }
  sVar5 = strlen(pcVar3);
  sVar6 = strlen(function);
  pcVar3 = (char *)INT_CMrealloc(pcVar3,sVar5 + sVar6 + 1);
  sVar5 = strlen(pcVar3);
  strcpy(pcVar3 + sVar5,function);
  return pcVar3;
}

Assistant:

extern char *
INT_create_multityped_action_spec(FMStructDescList *input_format_lists, char *function)
{
    int list_count = 0;
    int l, i;
    char *str;
    while(input_format_lists && input_format_lists[list_count] != NULL)
	list_count++;

    str = malloc(50);
    sprintf(str, "Multityped Action   List Count %d\n", list_count);

    for (l = 0; l < list_count; l++) {
	int format_count = 0;
	FMStructDescList format_list = input_format_lists[l];
	while(format_list && format_list[format_count].format_name != NULL)
	    format_count++;
	str = realloc(str, strlen(str) + 50);
	sprintf(str + strlen(str), "Next format   Subformat Count %d\n",
		format_count);
	for (i = 0 ; i < format_count; i++) {
	    str = add_FMfieldlist_to_string(str, &format_list[i]);
	}
    }

    str = realloc(str, strlen(str) + strlen(function) + 1);
    strcpy(&str[strlen(str)], function);
    return str;
}